

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::peer_disconnected_alert::~peer_disconnected_alert(peer_disconnected_alert *this)

{
  peer_disconnected_alert *this_local;
  
  std::__cxx11::string::~string((string *)&this->msg);
  peer_alert::~peer_alert(&this->super_peer_alert);
  return;
}

Assistant:

struct TORRENT_EXPORT peer_disconnected_alert final : peer_alert
	{
		// internal
		peer_disconnected_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, peer_id const& peer_id, operation_t op, int type, error_code const& e
			, close_reason_t r);

		TORRENT_DEFINE_ALERT(peer_disconnected_alert, 24)

		static constexpr alert_category_t static_category = alert_category::connect;
		std::string message() const override;

		// the kind of socket this peer was connected over
		int const socket_type;

		// the operation or level where the error occurred. Specified as an
		// value from the operation_t enum. Defined in operations.hpp.
		operation_t const op;

		// tells you what error caused peer to disconnect.
		error_code const error;

		// the reason the peer disconnected (if specified)
		close_reason_t const reason;

#if TORRENT_ABI_VERSION == 1
		int const TORRENT_DEPRECATED_MEMBER operation;
		std::string TORRENT_DEPRECATED_MEMBER msg;
#endif
	}